

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> *
CoreML::defaultSizeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ImageFeatureType *params)

{
  ImageFeatureType_EnumeratedImageSizes *pIVar1;
  Type *pTVar2;
  ImageFeatureType_ImageSizeRange *pIVar3;
  SizeRange *pSVar4;
  uint64 local_18;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18 = params->width_;
  if (((long)local_18 < 1) || (params->height_ < 1)) {
    if (params->_oneof_case_[0] == 0x1f) {
      pIVar3 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar4 = pIVar3->widthrange_;
      if (pSVar4 == (SizeRange *)0x0) {
        pSVar4 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_18 = pSVar4->lowerbound_;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (__return_storage_ptr__,(long *)&local_18);
      pIVar3 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar4 = pIVar3->heightrange_;
      if (pSVar4 == (SizeRange *)0x0) {
        pSVar4 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_18 = pSVar4->lowerbound_;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (__return_storage_ptr__,(long *)&local_18);
    }
    else if (params->_oneof_case_[0] == 0x15) {
      pIVar1 = Specification::ImageFeatureType::enumeratedsizes(params);
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                         (&(pIVar1->sizes_).super_RepeatedPtrFieldBase,0);
      local_18 = pTVar2->width_;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (__return_storage_ptr__,(long *)&local_18);
      pIVar1 = Specification::ImageFeatureType::enumeratedsizes(params);
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                         (&(pIVar1->sizes_).super_RepeatedPtrFieldBase,0);
      local_18 = pTVar2->height_;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (__return_storage_ptr__,(long *)&local_18);
    }
  }
  else {
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (__return_storage_ptr__,(long *)&local_18);
    local_18 = params->height_;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (__return_storage_ptr__,(long *)&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultSizeOf(const Specification::ImageFeatureType &params) {
        std::vector<int64_t> defaultSize;

        if (params.width() > 0 && params.height() > 0) {
            defaultSize.push_back((int64_t)params.width());
            defaultSize.push_back((int64_t)params.height());
            return defaultSize;
        }

        switch (params.SizeFlexibility_case()) {
            case Specification::ImageFeatureType::kEnumeratedSizes:
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).width());
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).height());
                break;
            case Specification::ImageFeatureType::kImageSizeRange:
                defaultSize.push_back((int64_t)params.imagesizerange().widthrange().lowerbound());
                defaultSize.push_back((int64_t)params.imagesizerange().heightrange().lowerbound());
                break;
            case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                break;
        }
        return defaultSize;
    }